

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_params.c
# Opt level: O0

bool_t ecpMOVIsMet(word *q,word *p,size_t n,size_t threshold,void *stack)

{
  int iVar1;
  word *in_RCX;
  word *in_RDX;
  word *in_R8;
  size_t unaff_retaddr;
  word *t2;
  word *t1;
  void *in_stack_ffffffffffffffb8;
  word *b;
  word *a;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  b = in_R8 + (long)in_RDX;
  a = b + (long)in_RDX;
  zzMod((word *)threshold,(word *)stack,(size_t)t1,t2,unaff_retaddr,
        (void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  wwCopy(b,in_R8,(size_t)in_RDX);
  iVar1 = wwCmpW(a,(size_t)in_R8,(word)b);
  while( true ) {
    if (iVar1 == 0) {
      return 0;
    }
    in_RCX = (word *)((long)in_RCX + -1);
    if (in_RCX == (word *)0x0) break;
    zzMulMod(in_RDX,in_RCX,a,in_R8,(size_t)b,in_stack_ffffffffffffffb8);
    iVar1 = wwCmpW(a,(size_t)in_R8,(word)b);
  }
  return 1;
}

Assistant:

bool_t ecpMOVIsMet(const word q[], const word p[], size_t n, 
	size_t threshold, void* stack)
{
	// переменные в stack
	word* t1 = (word*)stack;
	word* t2 = t1 + n;
	stack = t2 + n;
	// t1, t2 <- p mod q
	ASSERT(threshold > 0);
	zzMod(t1, p, n, q, n, stack);
	wwCopy(t2, t1, n);
	// p mod q == 1?
	if (wwCmpW(t2, n, 1) == 0)
		return FALSE;
	while (--threshold)
	{
		// p^i mod q == 1?
		zzMulMod(t2, t2, t1, q, n, stack);
		if (wwCmpW(t2, n, 1) == 0)
			return FALSE;
	}
	return TRUE;
}